

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktClippingTests.cpp
# Opt level: O0

void vkt::clipping::anon_unknown_0::addClippingTests(TestCaseGroup *clippingTestsGroup)

{
  CaseDefinition arg0;
  undefined8 uVar1;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  int *piVar5;
  VkPrimitiveTopology topology_00;
  VkPrimitiveTopology topology_01;
  VkPrimitiveTopology topology_02;
  char **extraout_RDX;
  char **value;
  char *pcVar6;
  char **extraout_RDX_00;
  int local_5c4;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  string local_470;
  int local_450;
  DefaultDeleter<tcu::TestCaseGroup> local_449;
  int numClipDistances;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group_4;
  undefined8 uStack_430;
  allocator<char> local_421;
  string local_420;
  VkPrimitiveTopology local_400;
  byte local_3fb;
  allocator<char> local_3fa;
  byte local_3f9;
  VkPrimitiveTopology topology;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string local_3b8;
  undefined1 local_398 [8];
  string caseName;
  int local_370;
  int local_36c;
  int local_368;
  int numCullPlanes;
  int numClipPlanes;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> shaderGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  undefined1 local_308 [8];
  string shaderGroupName;
  uint local_2e0;
  bool useGeometry;
  bool useTessellation;
  deUint32 shaderMask;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> mainGroup;
  undefined1 local_2a8 [8];
  string mainGroupName;
  int iStack_280;
  bool dynamicIndexing;
  int indexingMode;
  int groupNdx;
  deUint32 flagGeometry;
  deUint32 flagTessellation;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> clipDistanceGroup;
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  DefaultDeleter<tcu::TestCaseGroup> local_169;
  undefined1 local_168 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group_3;
  string local_150;
  string local_130;
  int local_110;
  DefaultDeleter<tcu::TestCaseGroup> local_109;
  int caseNdx_2;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group_2;
  string local_f0;
  string local_d0;
  int local_b0;
  DefaultDeleter<tcu::TestCaseGroup> local_a9;
  int caseNdx_1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group_1;
  string local_90;
  string local_70;
  int local_50;
  DefaultDeleter<tcu::TestCaseGroup> local_49;
  int caseNdx;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  undefined1 local_28 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> clipVolumeGroup;
  TestContext *testCtx;
  TestCaseGroup *clippingTestsGroup_local;
  
  clipVolumeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = tcu::TestNode::getTestContext(&clippingTestsGroup->super_TestNode);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    clipVolumeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"clip_volume","clipping with the clip volume");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
              m_data.field_0xb);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28,pTVar2
            );
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    clipVolumeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"inside","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_49);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&caseNdx,pTVar2
            );
  for (local_50 = 0; local_50 < 10; local_50 = local_50 + 1) {
    pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&caseNdx
                );
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              (&local_70,(drawutil *)(ulong)addClippingTests::cases[local_50],topology_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"",
               (allocator<char> *)
               &group_1.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    addFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
              (pTVar2,&local_70,&local_90,ClipVolume::initPrograms,ClipVolume::testPrimitivesInside,
               addClippingTests::cases[local_50]);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &group_1.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    std::__cxx11::string::~string((string *)&local_70);
  }
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_28)->super_TestNode;
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&caseNdx
                   )->super_TestNode;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&caseNdx);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    clipVolumeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"outside","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_a9);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&caseNdx_1,
             pTVar2);
  for (local_b0 = 0; local_b0 < 10; local_b0 = local_b0 + 1) {
    pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                 &caseNdx_1);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              (&local_d0,(drawutil *)(ulong)addClippingTests::cases[local_b0],topology_01);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"",
               (allocator<char> *)
               &group_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    addFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
              (pTVar2,&local_d0,&local_f0,ClipVolume::initPrograms,ClipVolume::testPrimitivesOutside
               ,addClippingTests::cases[local_b0]);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &group_2.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_28)->super_TestNode;
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &caseNdx_1)->super_TestNode;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&caseNdx_1);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    clipVolumeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"depth_clamp","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_109);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&caseNdx_2,
             pTVar2);
  for (local_110 = 0; local_110 < 10; local_110 = local_110 + 1) {
    pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                 &caseNdx_2);
    drawutil::getPrimitiveTopologyShortName_abi_cxx11_
              (&local_130,(drawutil *)(ulong)addClippingTests::cases[local_110],topology_02);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"",
               (allocator<char> *)
               &group_3.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    addFunctionCaseWithPrograms<vk::VkPrimitiveTopology>
              (pTVar2,&local_130,&local_150,ClipVolume::initPrograms,
               ClipVolume::testPrimitivesDepthClamp,addClippingTests::cases[local_110]);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               &group_3.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                .field_0xf);
    std::__cxx11::string::~string((string *)&local_130);
  }
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_28)->super_TestNode;
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &caseNdx_2)->super_TestNode;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&caseNdx_2);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    clipVolumeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"clipped","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_169);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_168,
             pTVar2);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"large_points",&local_191)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_1b9);
  addFunctionCaseWithPrograms
            (pTVar2,&local_190,&local_1b8,ClipVolume::initProgramsPointSize,
             ClipVolume::testLargePoints);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"wide_lines_axis_aligned",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"",&local_209);
  addFunctionCaseWithPrograms<vkt::clipping::(anonymous_namespace)::ClipVolume::LineOrientation>
            (pTVar2,&local_1e0,&local_208,ClipVolume::initPrograms,ClipVolume::testWideLines,
             LINE_ORIENTATION_AXIS_ALIGNED);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                     ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"wide_lines_diagonal",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"",
             (allocator<char> *)
             &clipDistanceGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  addFunctionCaseWithPrograms<vkt::clipping::(anonymous_namespace)::ClipVolume::LineOrientation>
            (pTVar2,&local_230,&local_258,ClipVolume::initPrograms,ClipVolume::testWideLines,
             LINE_ORIENTATION_DIAGONAL);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &clipDistanceGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_28)->super_TestNode;
  pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    local_168)->super_TestNode;
  tcu::TestNode::addChild(pTVar3,pTVar4);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_168);
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28
                   )->super_TestNode;
  tcu::TestNode::addChild(&clippingTestsGroup->super_TestNode,pTVar3);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    clipVolumeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"user_defined","user-defined clip planes");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&flagGeometry + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
             &flagTessellation,pTVar2);
  value = extraout_RDX;
  for (iStack_280 = 0; iStack_280 < 2; iStack_280 = iStack_280 + 1) {
    for (mainGroupName.field_2._12_4_ = 0; (int)mainGroupName.field_2._12_4_ < 2;
        mainGroupName.field_2._12_4_ = mainGroupName.field_2._12_4_ + 1) {
      mainGroupName.field_2._M_local_buf[0xb] = mainGroupName.field_2._12_4_ == 1;
      de::toString<char_const*>
                ((string *)
                 &mainGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8,(de *)(addClippingTests::caseGroups + iStack_280),value);
      pcVar6 = "";
      if ((mainGroupName.field_2._M_local_buf[0xb] & 1U) != 0) {
        pcVar6 = "_dynamic_index";
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &mainGroup.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data.field_0x8,pcVar6);
      std::__cxx11::string::~string
                ((string *)
                 &mainGroup.
                  super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                  m_data.field_0x8);
      pTVar2 = (TestCaseGroup *)operator_new(0x70);
      uVar1 = clipVolumeGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              _8_8_;
      pcVar6 = (char *)std::__cxx11::string::c_str();
      tcu::TestCaseGroup::TestCaseGroup(pTVar2,(TestContext *)uVar1,pcVar6,"");
      de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
                ((DefaultDeleter<tcu::TestCaseGroup> *)&useTessellation);
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&shaderMask
                 ,pTVar2);
      for (local_2e0 = 0; local_2e0 < 4; local_2e0 = local_2e0 + 1) {
        shaderGroupName.field_2._M_local_buf[0xf] = (byte)local_2e0 & 1;
        shaderGroupName.field_2._M_local_buf[0xe] = (char)((local_2e0 & 2) >> 1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"vert",
                   (allocator<char> *)
                   &shaderGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0xf);
        pcVar6 = "";
        if ((shaderGroupName.field_2._M_local_buf[0xf] & 1U) != 0) {
          pcVar6 = "_tess";
        }
        std::operator+(&local_328,&local_348,pcVar6);
        pcVar6 = "";
        if ((shaderGroupName.field_2._M_local_buf[0xe] & 1U) != 0) {
          pcVar6 = "_geom";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_308,&local_328,pcVar6);
        std::__cxx11::string::~string((string *)&local_328);
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   &shaderGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0xf);
        pTVar2 = (TestCaseGroup *)operator_new(0x70);
        uVar1 = clipVolumeGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._8_8_;
        pcVar6 = (char *)std::__cxx11::string::c_str();
        tcu::TestCaseGroup::TestCaseGroup(pTVar2,(TestContext *)uVar1,pcVar6,"");
        de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
                  ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&numCullPlanes + 3));
        de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                   &numClipPlanes,pTVar2);
        for (local_368 = 1; local_368 < 9; local_368 = local_368 + 1) {
          if ((addClippingTests::caseGroups[iStack_280].useCullDistance & 1U) == 0) {
            local_5c4 = 0;
          }
          else {
            local_370 = 8;
            caseName.field_2._12_4_ = 8 - local_368;
            piVar5 = std::min<int>(&stack0xfffffffffffffc90,
                                   (int *)(caseName.field_2._M_local_buf + 0xc));
            local_5c4 = *piVar5;
          }
          local_36c = local_5c4;
          de::toString<int>(&local_3b8,&local_368);
          local_3f9 = 0;
          local_3fb = 0;
          if (local_36c < 1) {
            std::allocator<char>::allocator();
            local_3fb = 1;
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d8,"",&local_3fa);
          }
          else {
            de::toString<int>((string *)&topology,&stack0xfffffffffffffc94);
            local_3f9 = 1;
            std::operator+(&local_3d8,"_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &topology);
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_398,&local_3b8,&local_3d8);
          std::__cxx11::string::~string((string *)&local_3d8);
          if ((local_3fb & 1) != 0) {
            std::allocator<char>::~allocator(&local_3fa);
          }
          if ((local_3f9 & 1) != 0) {
            std::__cxx11::string::~string((string *)&topology);
          }
          std::__cxx11::string::~string((string *)&local_3b8);
          local_400 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
          if ((shaderGroupName.field_2._M_local_buf[0xf] & 1U) != 0) {
            local_400 = VK_PRIMITIVE_TOPOLOGY_PATCH_LIST;
          }
          pTVar2 = de::details::
                   UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                             ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               *)&numClipPlanes);
          pcVar6 = addClippingTests::caseGroups[iStack_280].description;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,pcVar6,&local_421)
          ;
          ClipDistance::CaseDefinition::CaseDefinition
                    ((CaseDefinition *)
                     &group_4.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data.field_0x8,local_400,local_368,local_36c,
                     (bool)(shaderGroupName.field_2._M_local_buf[0xf] & 1),
                     (bool)(shaderGroupName.field_2._M_local_buf[0xe] & 1),
                     (bool)(mainGroupName.field_2._M_local_buf[0xb] & 1));
          arg0._8_8_ = uStack_430;
          arg0.topology =
               group_4.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               .m_data._8_4_;
          arg0.dynamicIndexing =
               (bool)group_4.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._12_1_;
          arg0.enableTessellation =
               (bool)group_4.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._13_1_;
          arg0.enableGeometry =
               (bool)group_4.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._14_1_;
          arg0._7_1_ = group_4.
                       super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                       .m_data._15_1_;
          addFunctionCaseWithPrograms<vkt::clipping::(anonymous_namespace)::ClipDistance::CaseDefinition>
                    (pTVar2,(string *)local_398,&local_420,ClipDistance::initPrograms,
                     ClipDistance::testClipDistance,arg0);
          std::__cxx11::string::~string((string *)&local_420);
          std::allocator<char>::~allocator(&local_421);
          std::__cxx11::string::~string((string *)local_398);
        }
        pTVar3 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)&shaderMask)->super_TestNode;
        pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                  ::release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                            &numClipPlanes)->super_TestNode;
        tcu::TestNode::addChild(pTVar3,pTVar4);
        de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                  ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                   &numClipPlanes);
        std::__cxx11::string::~string((string *)local_308);
      }
      pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)&flagTessellation)->super_TestNode;
      pTVar4 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                        &shaderMask)->super_TestNode;
      tcu::TestNode::addChild(pTVar3,pTVar4);
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&shaderMask
                );
      std::__cxx11::string::~string((string *)local_2a8);
      value = extraout_RDX_00;
    }
  }
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    clipVolumeGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"complementarity","");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_449);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
             &numClipDistances,pTVar2);
  for (local_450 = 1; local_450 < 9; local_450 = local_450 + 1) {
    pTVar2 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                 &numClipDistances);
    de::toString<int>(&local_490,&local_450);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_470,pcVar6,&local_491);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"",&local_4b9);
    addFunctionCaseWithPrograms<int>
              (pTVar2,&local_470,&local_4b8,ClipDistanceComplementarity::initPrograms,
               ClipDistanceComplementarity::testComplementarity,local_450);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::allocator<char>::~allocator(&local_4b9);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator(&local_491);
    std::__cxx11::string::~string((string *)&local_490);
  }
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &numClipDistances)->super_TestNode;
  tcu::TestNode::addChild(&clippingTestsGroup->super_TestNode,pTVar3);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
             &numClipDistances);
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &flagTessellation)->super_TestNode;
  tcu::TestNode::addChild(&clippingTestsGroup->super_TestNode,pTVar3);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
             &flagTessellation);
  return;
}

Assistant:

void addClippingTests (tcu::TestCaseGroup* clippingTestsGroup)
{
	tcu::TestContext& testCtx = clippingTestsGroup->getTestContext();

	// Clipping against the clip volume
	{
		using namespace ClipVolume;

		static const VkPrimitiveTopology cases[] =
		{
			VK_PRIMITIVE_TOPOLOGY_POINT_LIST,
			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,
			VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,
			VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY,
			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,
		};

		MovePtr<tcu::TestCaseGroup> clipVolumeGroup(new tcu::TestCaseGroup(testCtx, "clip_volume", "clipping with the clip volume"));

		// Fully inside the clip volume
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "inside", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesInside, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Fully outside the clip volume
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "outside", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesOutside, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Depth clamping
		{
			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "depth_clamp", ""));

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
				addFunctionCaseWithPrograms<VkPrimitiveTopology>(
					group.get(), getPrimitiveTopologyShortName(cases[caseNdx]), "", initPrograms, testPrimitivesDepthClamp, cases[caseNdx]);

			clipVolumeGroup->addChild(group.release());
		}

		// Large points and wide lines
		{
			// \note For both points and lines, if an unsupported size/width is selected, the nearest supported size will be chosen.
			//       We do have to check for feature support though.

			MovePtr<tcu::TestCaseGroup> group(new tcu::TestCaseGroup(testCtx, "clipped", ""));

			addFunctionCaseWithPrograms(group.get(), "large_points", "", initProgramsPointSize, testLargePoints);

			addFunctionCaseWithPrograms<LineOrientation>(group.get(), "wide_lines_axis_aligned", "", initPrograms, testWideLines, LINE_ORIENTATION_AXIS_ALIGNED);
			addFunctionCaseWithPrograms<LineOrientation>(group.get(), "wide_lines_diagonal",	 "", initPrograms, testWideLines, LINE_ORIENTATION_DIAGONAL);

			clipVolumeGroup->addChild(group.release());
		}

		clippingTestsGroup->addChild(clipVolumeGroup.release());
	}

	// User-defined clip planes
	{
		MovePtr<tcu::TestCaseGroup> clipDistanceGroup(new tcu::TestCaseGroup(testCtx, "user_defined", "user-defined clip planes"));

		// ClipDistance, CullDistance and maxCombinedClipAndCullDistances usage
		{
			using namespace ClipDistance;

			static const struct
			{
				const char* const	groupName;
				const char* const	description;
				bool				useCullDistance;
			} caseGroups[] =
			{
				{ "clip_distance",		"use ClipDistance",										false },
				{ "clip_cull_distance",	"use ClipDistance and CullDistance at the same time",	true  },
			};

			const deUint32 flagTessellation = 1u << 0;
			const deUint32 flagGeometry		= 1u << 1;

			for (int groupNdx = 0; groupNdx < DE_LENGTH_OF_ARRAY(caseGroups); ++groupNdx)
			for (int indexingMode = 0; indexingMode < 2; ++indexingMode)
			{
				const bool			dynamicIndexing	= (indexingMode == 1);
				const std::string	mainGroupName	= de::toString(caseGroups[groupNdx].groupName) + (dynamicIndexing ? "_dynamic_index" : "");

				MovePtr<tcu::TestCaseGroup>	mainGroup(new tcu::TestCaseGroup(testCtx, mainGroupName.c_str(), ""));

				for (deUint32 shaderMask = 0u; shaderMask <= (flagTessellation | flagGeometry); ++shaderMask)
				{
					const bool			useTessellation	= (shaderMask & flagTessellation) != 0;
					const bool			useGeometry		= (shaderMask & flagGeometry) != 0;
					const std::string	shaderGroupName	= std::string("vert") + (useTessellation ? "_tess" : "") + (useGeometry ? "_geom" : "");

					MovePtr<tcu::TestCaseGroup>	shaderGroup(new tcu::TestCaseGroup(testCtx, shaderGroupName.c_str(), ""));

					for (int numClipPlanes = 1; numClipPlanes <= MAX_CLIP_DISTANCES; ++numClipPlanes)
					{
						const int					numCullPlanes	= (caseGroups[groupNdx].useCullDistance
																		? std::min(static_cast<int>(MAX_CULL_DISTANCES), MAX_COMBINED_CLIP_AND_CULL_DISTANCES - numClipPlanes)
																		: 0);
						const std::string			caseName		= de::toString(numClipPlanes) + (numCullPlanes > 0 ? "_" + de::toString(numCullPlanes) : "");
						const VkPrimitiveTopology	topology		= (useTessellation ? VK_PRIMITIVE_TOPOLOGY_PATCH_LIST : VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);

						addFunctionCaseWithPrograms<CaseDefinition>(
							shaderGroup.get(), caseName, caseGroups[groupNdx].description, initPrograms, testClipDistance,
							CaseDefinition(topology, numClipPlanes, numCullPlanes, useTessellation, useGeometry, dynamicIndexing));
					}
					mainGroup->addChild(shaderGroup.release());
				}
				clipDistanceGroup->addChild(mainGroup.release());
			}
		}

		// Complementarity criterion (i.e. clipped and not clipped areas must add up to a complete primitive with no holes nor overlap)
		{
			using namespace ClipDistanceComplementarity;

			MovePtr<tcu::TestCaseGroup>	group(new tcu::TestCaseGroup(testCtx, "complementarity", ""));

			for (int numClipDistances = 1; numClipDistances <= MAX_CLIP_DISTANCES; ++numClipDistances)
				addFunctionCaseWithPrograms<int>(group.get(), de::toString(numClipDistances).c_str(), "", initPrograms, testComplementarity, numClipDistances);

			clippingTestsGroup->addChild(group.release());
		}

		clippingTestsGroup->addChild(clipDistanceGroup.release());
	}
}